

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void parse_options(int argc,char **argv,int program,_func_void_varargs *help,
                  _func_void_varargs *version)

{
  cartridge_t cart;
  int iVar1;
  uint uVar2;
  option_t *poVar3;
  char *pcVar4;
  size_t sVar5;
  code *in_RCX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  code *in_R8;
  char *p_1;
  char *p;
  option_t *opt;
  int i;
  option_t *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char **in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff94;
  gb_type_t gVar7;
  int local_2c;
  
  poVar3 = get_option((char *)in_stack_ffffffffffffff78);
  pcVar4 = (char *)mmalloc((size_t)in_stack_ffffffffffffff70);
  (poVar3->value).str = pcVar4;
  strcpy((poVar3->value).str,"out.gb");
  for (local_2c = 1; local_2c < in_EDI; local_2c = local_2c + 1) {
    if ((**(char **)(in_RSI + (long)local_2c * 8) == '-') &&
       (poVar3 = get_option((char *)in_stack_ffffffffffffff78), poVar3 != (option_t *)0x0)) {
      iVar1 = strcmp(poVar3->name,"--help");
      if (iVar1 == 0) {
        poVar3->set = 1;
      }
      else {
        iVar1 = strcmp(poVar3->name,"--version");
        if (iVar1 == 0) {
          poVar3->set = 1;
        }
      }
    }
  }
  poVar3 = get_option((char *)in_stack_ffffffffffffff78);
  if (poVar3->set == 0) {
    poVar3 = get_option((char *)in_stack_ffffffffffffff78);
    if (poVar3->set == 0) {
      for (local_2c = 1; local_2c < in_EDI; local_2c = local_2c + 1) {
        pcVar4 = *(char **)(in_RSI + (long)local_2c * 8);
        if (*pcVar4 == '-') {
          poVar3 = get_option((char *)in_stack_ffffffffffffff78);
          if (poVar3 == (option_t *)0x0) {
            ccerr(E,"unrecognized command line option \'%s\'.",
                  *(undefined8 *)(in_RSI + (long)local_2c * 8));
          }
          else {
            sVar5 = strlen(poVar3->name);
            if ((in_EDX == 1) && (poVar3->as_opt == 0)) {
              ccerr(E,"unrecognized command line option \'%s\'.",
                    *(undefined8 *)(in_RSI + (long)local_2c * 8));
            }
            else if ((in_EDX == 2) && (poVar3->ld_opt == 0)) {
              ccerr(E,"unrecognized command line option \'%s\'.",
                    *(undefined8 *)(in_RSI + (long)local_2c * 8));
            }
            else {
              poVar3->set = 1;
              if (poVar3->type == flag) {
                if (pcVar4[sVar5] != '\0') {
                  ccerr(E,"unrecognized command line option \'%s\'.",
                        *(undefined8 *)(in_RSI + (long)local_2c * 8));
                }
              }
              else if (poVar3->type == number) {
                read_number(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
              }
              else if (poVar3->type == string) {
                read_string((option_t *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                            in_stack_ffffffffffffff78);
              }
            }
          }
        }
        else {
          file_add((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        }
      }
      iVar1 = file_count();
      if (iVar1 == 0) {
        ccerr(F,"no input files.");
      }
      poVar3 = get_option((char *)in_stack_ffffffffffffff78);
      uVar6 = poVar3->set;
      poVar3 = get_option((char *)in_stack_ffffffffffffff78);
      uVar2 = uVar6 | poVar3->set;
      poVar3 = get_option((char *)in_stack_ffffffffffffff78);
      if (((uVar2 != 0 || poVar3->set != 0) &&
          (poVar3 = get_option((char *)in_stack_ffffffffffffff78), poVar3->set != 0)) &&
         (iVar1 = file_count(), 1 < iVar1)) {
        if (in_EDX == 0) {
          ccerr(F,"cannot specify -o with -E, -S or -c with multiple files");
        }
        else {
          ccerr(F,"cannot specify -o with -c with multiple files");
        }
      }
      poVar3 = get_option((char *)in_stack_ffffffffffffff78);
      if (((poVar3->value).num < 1) || (100 < (poVar3->value).num)) {
        (poVar3->value).num = 8;
        poVar3->set = 0;
      }
      gVar7 = cartridge.gb_type;
      cart.cart_type = in_stack_ffffffffffffff84;
      cart.gb_type._0_1_ = cartridge.title[8];
      cart.gb_type._1_1_ = cartridge.title[9];
      cart.gb_type._2_1_ = cartridge.title[10];
      cart.gb_type._3_1_ = cartridge._27_1_;
      cart._8_8_ = in_stack_ffffffffffffff88;
      cart.title[0] = (char)uVar6;
      cart.title[1] = (char)(uVar6 >> 8);
      cart.title[2] = (char)(uVar6 >> 0x10);
      cart.title[3] = (char)(uVar6 >> 0x18);
      cart.title[4] = (char)uVar2;
      cart.title[5] = (char)(uVar2 >> 8);
      cart.title[6] = (char)(uVar2 >> 0x10);
      cart.title[7] = (char)(uVar2 >> 0x18);
      cart.title[8] = (char)gVar7;
      cart.title[9] = (char)(gVar7 >> 8);
      cart.title[10] = (char)(gVar7 >> 0x10);
      cart._27_1_ = (char)(gVar7 >> 0x18);
      set_cartridge(cart);
    }
    else {
      (*in_R8)();
    }
  }
  else {
    (*in_RCX)();
  }
  return;
}

Assistant:

void parse_options(int argc, char** argv, int program, void(*help)(),
                   void(*version)())
{
    int i;
    option_t* opt;

    opt = get_option("-o");
    opt->value.str = (char*)mmalloc(7);
    strcpy(opt->value.str, "out.gb");

    for (i = 1; i < argc; ++i)
    {
        char* p = argv[i];
        if (*p == '-')
        {
            opt = get_option(p);
            if (!opt)
                continue;
            if (strcmp(opt->name, "--help") == 0)
                opt->set = 1;
            else if (strcmp(opt->name, "--version") == 0)
                opt->set = 1;
        }
    }

    /* Leave the function before source files are added */
    if (get_option("--help")->set)
    {
        (*help)();
        return;
    }

    if (get_option("--version")->set)
    {
        (*version)();
        return;
    }

    for (i = 1; i < argc; ++i)
    {
        char* p = argv[i];
        if (*p == '-')
        {
            /* HANDLE ADDITIONAL INCLUDE PATHS LIB PATHS ETC HERE */
            if ((opt = get_option(argv[i])))
            {
                p += strlen(opt->name);

                if (program == GBAS && !opt->as_opt)
                {
                    ccerr(E, "unrecognized command line option '%s'.", argv[i]);
                    continue;
                }

                if (program == GBLD && !opt->ld_opt)
                {
                    ccerr(E, "unrecognized command line option '%s'.", argv[i]);
                    continue;
                }

                opt->set = 1;
                if (opt->type != flag)
                {
                    if (opt->type == number)
                        read_number(p, opt);
                    else if (opt->type == string)
                        read_string(opt, &i, argc, argv);
                }
                else if (*p)
                {
                    /* Option name matched but there were additional
                    characters */
                    ccerr(E, "unrecognized command line option '%s'.", argv[i]);
                    continue;
                }
            }
            else
                ccerr(E, "unrecognized command line option '%s'.", argv[i]);
        }
        else
        {
            file_add(argv[i]);
        }
    }

    if (!file_count())
        ccerr(F, "no input files.");

    if ( (get_option("-E")->set | get_option("-S")->set | get_option("-c")->set)
         && get_option("-o")->set)
    {
        if (file_count() > 1)
        {
            if (program == GBCC)
                ccerr(F, "cannot specify -o with -E, -S or -c with multiple "
                         "files");
            else
                ccerr(F, "cannot specify -o with -c with multiple files");

        }
    }

    opt = get_option("-ftabstop=");
    if (opt->value.num < 1 || opt->value.num > 100)
    {
        opt->value.num = 8;
        opt->set = 0;
    }
    
    set_cartridge(cartridge);
}